

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O0

void __thiscall
duckdb::SimpleMultiFileList::SimpleMultiFileList
          (SimpleMultiFileList *this,vector<duckdb::OpenFileInfo,_true> *paths_p)

{
  vector<duckdb::OpenFileInfo,_true> *in_RDI;
  vector<duckdb::OpenFileInfo,_true> *in_stack_ffffffffffffffc8;
  vector<duckdb::OpenFileInfo,_true> *in_stack_ffffffffffffffd8;
  MultiFileList *in_stack_ffffffffffffffe0;
  
  vector<duckdb::OpenFileInfo,_true>::vector(in_RDI,in_stack_ffffffffffffffc8);
  MultiFileList::MultiFileList
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (FileGlobOptions)((ulong)in_RDI >> 0x38));
  vector<duckdb::OpenFileInfo,_true>::~vector((vector<duckdb::OpenFileInfo,_true> *)0x1555d30);
  (in_RDI->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__SimpleMultiFileList_03527aa8;
  return;
}

Assistant:

SimpleMultiFileList::SimpleMultiFileList(vector<OpenFileInfo> paths_p)
    : MultiFileList(std::move(paths_p), FileGlobOptions::ALLOW_EMPTY) {
}